

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgList.h
# Opt level: O2

void __thiscall dgList<dgClusterFace>::RemoveAll(dgList<dgClusterFace> *this)

{
  dgListNode *this_00;
  
  while( true ) {
    this_00 = this->m_first;
    if (this_00 == (dgListNode *)0x0) break;
    this->m_count = this->m_count + -1;
    this->m_first = this_00->m_next;
    dgListNode::Unlink(this_00);
    (*this_00->_vptr_dgListNode[1])(this_00);
  }
  if (this->m_count == 0) {
    this->m_last = (dgListNode *)0x0;
    this->m_first = (dgListNode *)0x0;
    return;
  }
  __assert_fail("m_count == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgList.h"
                ,0x24d,"void dgList<dgClusterFace>::RemoveAll() [T = dgClusterFace]");
}

Assistant:

void dgList<T>::RemoveAll ()
{
	for (dgListNode *node = m_first; node; node = m_first) {
		m_count --;
		m_first = node->GetNext();
//		node->Remove();
		node->Unlink();
		delete node;
	}
	HACD_ASSERT (m_count == 0);
	m_last = NULL;
	m_first = NULL;
}